

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

void * cgreen_vector_get(CgreenVector *vector,int position)

{
  int iVar1;
  uint in_ESI;
  CgreenVector *in_RDI;
  
  if (-1 < (int)in_ESI) {
    iVar1 = cgreen_vector_size(in_RDI);
    if ((int)in_ESI <= iVar1) {
      return in_RDI->items[(int)in_ESI];
    }
  }
  panic("src/vector.c",0x4e,"CGREEN INTERNAL ERROR: illegal position (%d) in vector operation",
        (ulong)in_ESI);
}

Assistant:

void *cgreen_vector_get(const CgreenVector *vector, int position) {
    if (position < 0 || position > cgreen_vector_size(vector)) {
        PANIC("CGREEN INTERNAL ERROR: illegal position (%d) in vector operation", position);
        return NULL;
    }
    return vector->items[position];
}